

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

void luaH_resize(lua_State *L,Table *t,uint newasize,uint nhsize)

{
  lu_byte lVar1;
  byte bVar2;
  Node *block;
  Node *pNVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  uint uVar32;
  TValue *pTVar33;
  lu_byte *plVar34;
  long lVar35;
  ulong uVar36;
  Node *old;
  Node *value;
  ulong uVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar59;
  int iVar62;
  int iVar63;
  undefined1 auVar60 [16];
  int iVar64;
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar78;
  int iVar82;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  Value local_90;
  lu_byte local_88;
  Table local_80;
  Node *local_48;
  Node *pNStack_40;
  
  uVar32 = luaH_realasize(t);
  t->alimit = uVar32;
  t->flags = t->flags & 0x7f;
  setnodevector(L,&local_80,nhsize);
  uVar36 = (ulong)newasize;
  uVar37 = (ulong)uVar32;
  if (newasize < uVar32) {
    t->alimit = newasize;
    lVar1 = t->lsizenode;
    local_48 = t->node;
    pNStack_40 = t->lastfree;
    t->lsizenode = local_80.lsizenode;
    t->node = local_80.node;
    t->lastfree = local_80.lastfree;
    lVar35 = uVar36 << 4;
    uVar38 = uVar36;
    do {
      uVar38 = uVar38 + 1;
      if (((&t->array->tt_)[lVar35] & 0xf) != 0) {
        luaH_setint(L,t,uVar38,(TValue *)((long)&t->array->value_ + lVar35));
      }
      lVar35 = lVar35 + 0x10;
    } while (uVar38 != uVar37);
    t->alimit = uVar32;
    local_80.lsizenode = t->lsizenode;
    t->lsizenode = lVar1;
    local_80.node = t->node;
    local_80.lastfree = t->lastfree;
    in_XMM1._8_8_ = pNStack_40;
    in_XMM1._0_8_ = local_48;
    t->node = local_48;
    t->lastfree = pNStack_40;
  }
  pTVar33 = (TValue *)luaM_realloc_(L,t->array,uVar37 * 0x10,uVar36 << 4);
  if ((newasize != 0) && (pTVar33 == (TValue *)0x0)) {
    luaH_resize();
  }
  bVar2 = t->lsizenode;
  block = t->node;
  pNVar3 = t->lastfree;
  t->lsizenode = local_80.lsizenode;
  t->node = local_80.node;
  t->lastfree = local_80.lastfree;
  t->array = pTVar33;
  t->alimit = newasize;
  auVar31 = _DAT_0016bb10;
  auVar30 = _DAT_0016bb00;
  auVar29 = _DAT_0016baf0;
  auVar28 = _DAT_0016bae0;
  auVar27 = _DAT_0016bad0;
  auVar26 = _DAT_0016bac0;
  auVar25 = _DAT_00164360;
  if (uVar32 < newasize) {
    lVar35 = (uVar36 - uVar37) + -1;
    auVar39._8_4_ = (int)lVar35;
    auVar39._0_8_ = lVar35;
    auVar39._12_4_ = (int)((ulong)lVar35 >> 0x20);
    plVar34 = &pTVar33[uVar37 + 0xf].tt_;
    uVar38 = 0;
    do {
      auVar57._8_4_ = (int)uVar38;
      auVar57._0_8_ = uVar38;
      auVar57._12_4_ = (int)(uVar38 >> 0x20);
      auVar60 = auVar39 ^ auVar25;
      auVar65 = (auVar57 | auVar31) ^ auVar25;
      iVar59 = auVar60._0_4_;
      iVar78 = -(uint)(iVar59 < auVar65._0_4_);
      iVar62 = auVar60._4_4_;
      auVar67._4_4_ = -(uint)(iVar62 < auVar65._4_4_);
      iVar63 = auVar60._8_4_;
      iVar82 = -(uint)(iVar63 < auVar65._8_4_);
      iVar64 = auVar60._12_4_;
      auVar67._12_4_ = -(uint)(iVar64 < auVar65._12_4_);
      auVar40._4_4_ = iVar78;
      auVar40._0_4_ = iVar78;
      auVar40._8_4_ = iVar82;
      auVar40._12_4_ = iVar82;
      auVar40 = pshuflw(in_XMM1,auVar40,0xe8);
      auVar66._4_4_ = -(uint)(auVar65._4_4_ == iVar62);
      auVar66._12_4_ = -(uint)(auVar65._12_4_ == iVar64);
      auVar66._0_4_ = auVar66._4_4_;
      auVar66._8_4_ = auVar66._12_4_;
      auVar49 = pshuflw(in_XMM2,auVar66,0xe8);
      auVar67._0_4_ = auVar67._4_4_;
      auVar67._8_4_ = auVar67._12_4_;
      auVar65 = pshuflw(auVar40,auVar67,0xe8);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      auVar60 = (auVar65 | auVar49 & auVar40) ^ auVar60;
      auVar60 = packssdw(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        plVar34[-0xf0] = 0x10;
      }
      auVar49._4_4_ = iVar78;
      auVar49._0_4_ = iVar78;
      auVar49._8_4_ = iVar82;
      auVar49._12_4_ = iVar82;
      auVar67 = auVar66 & auVar49 | auVar67;
      auVar60 = packssdw(auVar67,auVar67);
      auVar65._8_4_ = 0xffffffff;
      auVar65._0_8_ = 0xffffffffffffffff;
      auVar65._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar65,auVar60 ^ auVar65);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60._0_4_ >> 8 & 1) != 0) {
        plVar34[-0xe0] = 0x10;
      }
      auVar60 = (auVar57 | auVar30) ^ auVar25;
      auVar50._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
      auVar50._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
      auVar50._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
      auVar50._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
      auVar68._4_4_ = auVar50._0_4_;
      auVar68._0_4_ = auVar50._0_4_;
      auVar68._8_4_ = auVar50._8_4_;
      auVar68._12_4_ = auVar50._8_4_;
      iVar78 = -(uint)(auVar60._4_4_ == iVar62);
      iVar82 = -(uint)(auVar60._12_4_ == iVar64);
      auVar13._4_4_ = iVar78;
      auVar13._0_4_ = iVar78;
      auVar13._8_4_ = iVar82;
      auVar13._12_4_ = iVar82;
      auVar79._4_4_ = auVar50._4_4_;
      auVar79._0_4_ = auVar50._4_4_;
      auVar79._8_4_ = auVar50._12_4_;
      auVar79._12_4_ = auVar50._12_4_;
      auVar60 = auVar13 & auVar68 | auVar79;
      auVar60 = packssdw(auVar60,auVar60);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar4,auVar60 ^ auVar4);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60._0_4_ >> 0x10 & 1) != 0) {
        plVar34[-0xd0] = 0x10;
      }
      auVar60 = pshufhw(auVar60,auVar68,0x84);
      auVar14._4_4_ = iVar78;
      auVar14._0_4_ = iVar78;
      auVar14._8_4_ = iVar82;
      auVar14._12_4_ = iVar82;
      auVar65 = pshufhw(auVar50,auVar14,0x84);
      auVar40 = pshufhw(auVar60,auVar79,0x84);
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      auVar41 = (auVar40 | auVar65 & auVar60) ^ auVar41;
      auVar60 = packssdw(auVar41,auVar41);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60._0_4_ >> 0x18 & 1) != 0) {
        plVar34[-0xc0] = 0x10;
      }
      auVar60 = (auVar57 | auVar29) ^ auVar25;
      auVar51._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
      auVar51._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
      auVar51._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
      auVar51._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
      auVar15._4_4_ = auVar51._0_4_;
      auVar15._0_4_ = auVar51._0_4_;
      auVar15._8_4_ = auVar51._8_4_;
      auVar15._12_4_ = auVar51._8_4_;
      auVar65 = pshuflw(auVar79,auVar15,0xe8);
      auVar42._0_4_ = -(uint)(auVar60._0_4_ == iVar59);
      auVar42._4_4_ = -(uint)(auVar60._4_4_ == iVar62);
      auVar42._8_4_ = -(uint)(auVar60._8_4_ == iVar63);
      auVar42._12_4_ = -(uint)(auVar60._12_4_ == iVar64);
      auVar69._4_4_ = auVar42._4_4_;
      auVar69._0_4_ = auVar42._4_4_;
      auVar69._8_4_ = auVar42._12_4_;
      auVar69._12_4_ = auVar42._12_4_;
      auVar60 = pshuflw(auVar42,auVar69,0xe8);
      auVar70._4_4_ = auVar51._4_4_;
      auVar70._0_4_ = auVar51._4_4_;
      auVar70._8_4_ = auVar51._12_4_;
      auVar70._12_4_ = auVar51._12_4_;
      auVar40 = pshuflw(auVar51,auVar70,0xe8);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 & auVar65,(auVar40 | auVar60 & auVar65) ^ auVar5);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        plVar34[-0xb0] = 0x10;
      }
      auVar16._4_4_ = auVar51._0_4_;
      auVar16._0_4_ = auVar51._0_4_;
      auVar16._8_4_ = auVar51._8_4_;
      auVar16._12_4_ = auVar51._8_4_;
      auVar70 = auVar69 & auVar16 | auVar70;
      auVar40 = packssdw(auVar70,auVar70);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60,auVar40 ^ auVar6);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60._4_2_ >> 8 & 1) != 0) {
        plVar34[-0xa0] = 0x10;
      }
      auVar60 = (auVar57 | auVar28) ^ auVar25;
      auVar52._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
      auVar52._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
      auVar52._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
      auVar52._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
      auVar71._4_4_ = auVar52._0_4_;
      auVar71._0_4_ = auVar52._0_4_;
      auVar71._8_4_ = auVar52._8_4_;
      auVar71._12_4_ = auVar52._8_4_;
      iVar78 = -(uint)(auVar60._4_4_ == iVar62);
      iVar82 = -(uint)(auVar60._12_4_ == iVar64);
      auVar17._4_4_ = iVar78;
      auVar17._0_4_ = iVar78;
      auVar17._8_4_ = iVar82;
      auVar17._12_4_ = iVar82;
      auVar80._4_4_ = auVar52._4_4_;
      auVar80._0_4_ = auVar52._4_4_;
      auVar80._8_4_ = auVar52._12_4_;
      auVar80._12_4_ = auVar52._12_4_;
      auVar60 = auVar17 & auVar71 | auVar80;
      auVar60 = packssdw(auVar60,auVar60);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar7,auVar60 ^ auVar7);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        plVar34[-0x90] = 0x10;
      }
      auVar60 = pshufhw(auVar60,auVar71,0x84);
      auVar18._4_4_ = iVar78;
      auVar18._0_4_ = iVar78;
      auVar18._8_4_ = iVar82;
      auVar18._12_4_ = iVar82;
      auVar65 = pshufhw(auVar52,auVar18,0x84);
      auVar40 = pshufhw(auVar60,auVar80,0x84);
      auVar43._8_4_ = 0xffffffff;
      auVar43._0_8_ = 0xffffffffffffffff;
      auVar43._12_4_ = 0xffffffff;
      auVar43 = (auVar40 | auVar65 & auVar60) ^ auVar43;
      auVar60 = packssdw(auVar43,auVar43);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60._6_2_ >> 8 & 1) != 0) {
        plVar34[-0x80] = 0x10;
      }
      auVar60 = (auVar57 | auVar27) ^ auVar25;
      auVar53._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
      auVar53._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
      auVar53._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
      auVar53._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
      auVar19._4_4_ = auVar53._0_4_;
      auVar19._0_4_ = auVar53._0_4_;
      auVar19._8_4_ = auVar53._8_4_;
      auVar19._12_4_ = auVar53._8_4_;
      auVar65 = pshuflw(auVar80,auVar19,0xe8);
      auVar44._0_4_ = -(uint)(auVar60._0_4_ == iVar59);
      auVar44._4_4_ = -(uint)(auVar60._4_4_ == iVar62);
      auVar44._8_4_ = -(uint)(auVar60._8_4_ == iVar63);
      auVar44._12_4_ = -(uint)(auVar60._12_4_ == iVar64);
      auVar72._4_4_ = auVar44._4_4_;
      auVar72._0_4_ = auVar44._4_4_;
      auVar72._8_4_ = auVar44._12_4_;
      auVar72._12_4_ = auVar44._12_4_;
      auVar60 = pshuflw(auVar44,auVar72,0xe8);
      auVar73._4_4_ = auVar53._4_4_;
      auVar73._0_4_ = auVar53._4_4_;
      auVar73._8_4_ = auVar53._12_4_;
      auVar73._12_4_ = auVar53._12_4_;
      auVar40 = pshuflw(auVar53,auVar73,0xe8);
      auVar54._8_4_ = 0xffffffff;
      auVar54._0_8_ = 0xffffffffffffffff;
      auVar54._12_4_ = 0xffffffff;
      auVar54 = (auVar40 | auVar60 & auVar65) ^ auVar54;
      auVar40 = packssdw(auVar54,auVar54);
      auVar60 = packsswb(auVar60 & auVar65,auVar40);
      if ((auVar60 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        plVar34[-0x70] = 0x10;
      }
      auVar20._4_4_ = auVar53._0_4_;
      auVar20._0_4_ = auVar53._0_4_;
      auVar20._8_4_ = auVar53._8_4_;
      auVar20._12_4_ = auVar53._8_4_;
      auVar73 = auVar72 & auVar20 | auVar73;
      auVar40 = packssdw(auVar73,auVar73);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar8,auVar40 ^ auVar8);
      auVar60 = packsswb(auVar60,auVar40);
      if ((auVar60._8_2_ >> 8 & 1) != 0) {
        plVar34[-0x60] = 0x10;
      }
      auVar60 = (auVar57 | auVar26) ^ auVar25;
      auVar55._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
      auVar55._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
      auVar55._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
      auVar55._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
      auVar74._4_4_ = auVar55._0_4_;
      auVar74._0_4_ = auVar55._0_4_;
      auVar74._8_4_ = auVar55._8_4_;
      auVar74._12_4_ = auVar55._8_4_;
      iVar78 = -(uint)(auVar60._4_4_ == iVar62);
      iVar82 = -(uint)(auVar60._12_4_ == iVar64);
      auVar21._4_4_ = iVar78;
      auVar21._0_4_ = iVar78;
      auVar21._8_4_ = iVar82;
      auVar21._12_4_ = iVar82;
      auVar81._4_4_ = auVar55._4_4_;
      auVar81._0_4_ = auVar55._4_4_;
      auVar81._8_4_ = auVar55._12_4_;
      auVar81._12_4_ = auVar55._12_4_;
      auVar60 = auVar21 & auVar74 | auVar81;
      auVar60 = packssdw(auVar60,auVar60);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar9,auVar60 ^ auVar9);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        plVar34[-0x50] = 0x10;
      }
      auVar60 = pshufhw(auVar60,auVar74,0x84);
      auVar22._4_4_ = iVar78;
      auVar22._0_4_ = iVar78;
      auVar22._8_4_ = iVar82;
      auVar22._12_4_ = iVar82;
      auVar65 = pshufhw(auVar55,auVar22,0x84);
      auVar40 = pshufhw(auVar60,auVar81,0x84);
      auVar45._8_4_ = 0xffffffff;
      auVar45._0_8_ = 0xffffffffffffffff;
      auVar45._12_4_ = 0xffffffff;
      auVar45 = (auVar40 | auVar65 & auVar60) ^ auVar45;
      auVar60 = packssdw(auVar45,auVar45);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60._10_2_ >> 8 & 1) != 0) {
        plVar34[-0x40] = 0x10;
      }
      auVar60 = (auVar57 | _DAT_0016bab0) ^ auVar25;
      auVar56._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
      auVar56._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
      auVar56._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
      auVar56._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
      auVar23._4_4_ = auVar56._0_4_;
      auVar23._0_4_ = auVar56._0_4_;
      auVar23._8_4_ = auVar56._8_4_;
      auVar23._12_4_ = auVar56._8_4_;
      auVar65 = pshuflw(auVar81,auVar23,0xe8);
      auVar46._0_4_ = -(uint)(auVar60._0_4_ == iVar59);
      auVar46._4_4_ = -(uint)(auVar60._4_4_ == iVar62);
      auVar46._8_4_ = -(uint)(auVar60._8_4_ == iVar63);
      auVar46._12_4_ = -(uint)(auVar60._12_4_ == iVar64);
      auVar75._4_4_ = auVar46._4_4_;
      auVar75._0_4_ = auVar46._4_4_;
      auVar75._8_4_ = auVar46._12_4_;
      auVar75._12_4_ = auVar46._12_4_;
      auVar60 = pshuflw(auVar46,auVar75,0xe8);
      auVar76._4_4_ = auVar56._4_4_;
      auVar76._0_4_ = auVar56._4_4_;
      auVar76._8_4_ = auVar56._12_4_;
      auVar76._12_4_ = auVar56._12_4_;
      auVar40 = pshuflw(auVar56,auVar76,0xe8);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 & auVar65,(auVar40 | auVar60 & auVar65) ^ auVar10);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        plVar34[-0x30] = 0x10;
      }
      auVar24._4_4_ = auVar56._0_4_;
      auVar24._0_4_ = auVar56._0_4_;
      auVar24._8_4_ = auVar56._8_4_;
      auVar24._12_4_ = auVar56._8_4_;
      auVar76 = auVar75 & auVar24 | auVar76;
      auVar40 = packssdw(auVar76,auVar76);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60,auVar40 ^ auVar11);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60._12_2_ >> 8 & 1) != 0) {
        plVar34[-0x20] = 0x10;
      }
      auVar60 = (auVar57 | _DAT_0016baa0) ^ auVar25;
      auVar47._0_4_ = -(uint)(iVar59 < auVar60._0_4_);
      auVar47._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
      auVar47._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
      auVar47._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
      auVar77._4_4_ = auVar47._0_4_;
      auVar77._0_4_ = auVar47._0_4_;
      auVar77._8_4_ = auVar47._8_4_;
      auVar77._12_4_ = auVar47._8_4_;
      auVar58._4_4_ = -(uint)(auVar60._4_4_ == iVar62);
      auVar58._12_4_ = -(uint)(auVar60._12_4_ == iVar64);
      auVar58._0_4_ = auVar58._4_4_;
      auVar58._8_4_ = auVar58._12_4_;
      auVar61._4_4_ = auVar47._4_4_;
      auVar61._0_4_ = auVar47._4_4_;
      auVar61._8_4_ = auVar47._12_4_;
      auVar61._12_4_ = auVar47._12_4_;
      auVar40 = auVar58 & auVar77 | auVar61;
      auVar60 = packssdw(auVar47,auVar40);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar12,auVar60 ^ auVar12);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        plVar34[-0x10] = 0x10;
      }
      auVar60 = pshufhw(auVar60,auVar77,0x84);
      in_XMM2 = pshufhw(auVar40,auVar58,0x84);
      in_XMM2 = in_XMM2 & auVar60;
      auVar60 = pshufhw(auVar60,auVar61,0x84);
      auVar48._8_4_ = 0xffffffff;
      auVar48._0_8_ = 0xffffffffffffffff;
      auVar48._12_4_ = 0xffffffff;
      auVar48 = (auVar60 | in_XMM2) ^ auVar48;
      auVar60 = packssdw(auVar48,auVar48);
      in_XMM1 = packsswb(auVar60,auVar60);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        *plVar34 = '\x10';
      }
      uVar38 = uVar38 + 0x10;
      plVar34 = plVar34 + 0x100;
    } while (((uVar36 - uVar37) + 0xf & 0xfffffffffffffff0) != uVar38);
  }
  uVar32 = 1 << (bVar2 & 0x1f);
  if (bVar2 != 0x1f) {
    uVar36 = 1;
    if (1 < (int)uVar32) {
      uVar36 = (ulong)uVar32;
    }
    value = block;
    do {
      if (((value->u).tt_ & 0xf) != 0) {
        local_90 = (value->u).key_val;
        local_88 = (value->u).key_tt;
        luaH_set(L,t,(TValue *)&local_90,&value->i_val);
      }
      value = value + 1;
      uVar36 = uVar36 - 1;
    } while (uVar36 != 0);
  }
  if (pNVar3 != (Node *)0x0) {
    luaM_free_(L,block,(long)(int)uVar32 * 0x18);
    return;
  }
  return;
}

Assistant:

void luaH_resize (lua_State *L, Table *t, unsigned int newasize,
                                          unsigned int nhsize) {
  unsigned int i;
  Table newt;  /* to keep the new hash part */
  unsigned int oldasize = setlimittosize(t);
  TValue *newarray;
  /* create new hash part with appropriate size into 'newt' */
  setnodevector(L, &newt, nhsize);
  if (newasize < oldasize) {  /* will array shrink? */
    t->alimit = newasize;  /* pretend array has new size... */
    exchangehashpart(t, &newt);  /* and new hash */
    /* re-insert into the new hash the elements from vanishing slice */
    for (i = newasize; i < oldasize; i++) {
      if (!isempty(&t->array[i]))
        luaH_setint(L, t, i + 1, &t->array[i]);
    }
    t->alimit = oldasize;  /* restore current size... */
    exchangehashpart(t, &newt);  /* and hash (in case of errors) */
  }
  /* allocate new array */
  newarray = luaM_reallocvector(L, t->array, oldasize, newasize, TValue);
  if (l_unlikely(newarray == NULL && newasize > 0)) {  /* allocation failed? */
    freehash(L, &newt);  /* release new hash part */
    luaM_error(L);  /* raise error (with array unchanged) */
  }
  /* allocation ok; initialize new part of the array */
  exchangehashpart(t, &newt);  /* 't' has the new hash ('newt' has the old) */
  t->array = newarray;  /* set new array part */
  t->alimit = newasize;
  for (i = oldasize; i < newasize; i++)  /* clear new slice of the array */
     setempty(&t->array[i]);
  /* re-insert elements from old hash part into new parts */
  reinsert(L, &newt, t);  /* 'newt' now has the old hash */
  freehash(L, &newt);  /* free old hash part */
}